

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O0

float grow(float x,int y)

{
  ostream *poVar1;
  int in_EDI;
  float in_XMM0_Da;
  int i;
  int local_c;
  float local_4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"grow (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Da);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_4 = in_XMM0_Da;
  for (local_c = 0; local_c < in_EDI; local_c = local_c + 1) {
    local_4 = local_4 * local_4;
  }
  return local_4;
}

Assistant:

float
grow (float x, int y)
{
    std::cout << "grow (" << x << ", " << y << ")" << std::endl;

    for (int i = 0; i < y; i++)
	x = x * x;

    return x;
}